

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O0

void FlatStream_UpdateBitmap(TBlockStream *pStream,ULONGLONG StartOffset,ULONGLONG EndOffset)

{
  uint uVar1;
  void *pvVar2;
  byte local_35;
  uint local_34;
  BYTE BitMask;
  DWORD ByteIndex;
  DWORD BlockSize;
  DWORD BlockIndex;
  LPBYTE FileBitmap;
  ULONGLONG EndOffset_local;
  ULONGLONG StartOffset_local;
  TBlockStream *pStream_local;
  
  pvVar2 = pStream->FileBitmap;
  uVar1 = pStream->BlockSize;
  if ((StartOffset & uVar1 - 1) != 0) {
    __assert_fail("(StartOffset & (BlockSize - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x48c,"void FlatStream_UpdateBitmap(TBlockStream *, ULONGLONG, ULONGLONG)");
  }
  if (pvVar2 != (void *)0x0) {
    local_34 = (uint)(StartOffset / uVar1) >> 3;
    local_35 = (byte)(1 << ((byte)(StartOffset / uVar1) & 7));
    for (EndOffset_local = StartOffset; EndOffset_local < EndOffset;
        EndOffset_local = uVar1 + EndOffset_local) {
      *(byte *)((long)pvVar2 + (ulong)local_34) =
           *(byte *)((long)pvVar2 + (ulong)local_34) | local_35;
      local_34 = ((int)(uint)local_35 >> 7) + local_34;
      local_35 = (byte)((int)(uint)local_35 >> 7) | local_35 << 1;
    }
    pStream->IsModified = 1;
    return;
  }
  __assert_fail("FileBitmap != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                ,0x48d,"void FlatStream_UpdateBitmap(TBlockStream *, ULONGLONG, ULONGLONG)");
}

Assistant:

static void FlatStream_UpdateBitmap(
    TBlockStream * pStream,                // Pointer to an open stream
    ULONGLONG StartOffset,
    ULONGLONG EndOffset)
{
    LPBYTE FileBitmap = (LPBYTE)pStream->FileBitmap;
    DWORD BlockIndex;
    DWORD BlockSize = pStream->BlockSize;
    DWORD ByteIndex;
    BYTE BitMask;

    // Sanity checks
    assert((StartOffset & (BlockSize - 1)) == 0);
    assert(FileBitmap != NULL);

    // Calculate the index of the block
    BlockIndex = (DWORD)(StartOffset / BlockSize);
    ByteIndex = (BlockIndex / 0x08);
    BitMask = (BYTE)(1 << (BlockIndex & 0x07));

    // Set all bits for the specified range
    while(StartOffset < EndOffset)
    {
        // Set the bit
        FileBitmap[ByteIndex] |= BitMask;

        // Move all
        StartOffset += BlockSize;
        ByteIndex += (BitMask >> 0x07);
        BitMask = (BitMask >> 0x07) | (BitMask << 0x01);
    }

    // Increment the bitmap update count
    pStream->IsModified = 1;
}